

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O1

size_t phyr::getL1CacheLineSize(void)

{
  uint *puVar1;
  long lVar2;
  size_t sVar3;
  size_t l1sz;
  fstream fs;
  undefined1 auStack_228 [8];
  size_t local_220;
  ulong local_218 [3];
  uint auStack_1fc [125];
  
  std::fstream::fstream(local_218);
  lVar2 = *(long *)(local_218[0] - 0x18);
  puVar1 = (uint *)((long)auStack_1fc + lVar2);
  *puVar1 = *puVar1 | 4;
  std::ios::clear((int)auStack_228 + (int)lVar2 + 0x10);
  local_220 = 0x40;
  std::fstream::open((char *)local_218,0x1060d8);
  std::istream::_M_extract<unsigned_long>(local_218);
  sVar3 = local_220;
  std::fstream::~fstream(local_218);
  return sVar3;
}

Assistant:

size_t getL1CacheLineSize() {
    std::fstream fs;
    // Set fstream to throw an exception in case of a failure
    fs.exceptions(fs.exceptions() | std::ios::failbit);

    // Data path for L1 cache (Unix systems)
    const char* cacheDataPath = "/sys/devices/system/cpu/cpu0"
                                "/cache/index1/coherency_line_size";

    size_t l1sz = DEF_PHYR_L1_CACHE_LINESZ;
    try {
        fs.open(cacheDataPath, std::fstream::in);
        fs >> l1sz;
    } catch (std::ios::failure&) {}

    return l1sz;
}